

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

bool __thiscall QMainWindow::isSeparator(QMainWindow *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QMainWindowPrivate *d;
  QPoint *in_stack_ffffffffffffffe0;
  QDockAreaLayout *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QMainWindow *)0x5eafaa);
  QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eafc0);
  QDockAreaLayout::findSeparator(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  bVar2 = QList<int>::isEmpty((QList<int> *)0x5eafe6);
  QList<int>::~QList((QList<int> *)0x5eaff5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return !bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindow::isSeparator(const QPoint &pos) const
{
#if QT_CONFIG(dockwidget)
    Q_D(const QMainWindow);
    return !d->layout->layoutState.dockAreaLayout.findSeparator(pos).isEmpty();
#else
    Q_UNUSED(pos);
    return false;
#endif
}